

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorTables::AddFieldByNumber
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  bool bVar1;
  int iVar2;
  Descriptor *pDVar3;
  FieldDescriptor *pFVar4;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>::iterator,_bool>
  local_38;
  FieldDescriptor *local_20;
  FieldDescriptor *field_local;
  FileDescriptorTables *this_local;
  
  local_20 = field;
  field_local = (FieldDescriptor *)this;
  pDVar3 = FieldDescriptor::containing_type(field);
  if ((pDVar3 != (Descriptor *)0x0) && (iVar2 = FieldDescriptor::number(local_20), 0 < iVar2)) {
    iVar2 = FieldDescriptor::number(local_20);
    pDVar3 = FieldDescriptor::containing_type(local_20);
    if (iVar2 <= (int)(uint)pDVar3->sequential_field_limit_) {
      bVar1 = FieldDescriptor::is_extension(local_20);
      if (!bVar1) {
        pDVar3 = FieldDescriptor::containing_type(local_20);
        iVar2 = FieldDescriptor::number(local_20);
        pFVar4 = Descriptor::field(pDVar3,iVar2 + -1);
        return pFVar4 == local_20;
      }
      return false;
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::insert<google::protobuf::FieldDescriptor_*,_0>
            (&local_38,
             &(this->fields_by_number_).
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ,&local_20);
  return (bool)(local_38.second & 1);
}

Assistant:

bool FileDescriptorTables::AddFieldByNumber(FieldDescriptor* field) {
  // Skip fields that are at the start of the sequence.
  if (field->containing_type() != nullptr && field->number() >= 1 &&
      field->number() <= field->containing_type()->sequential_field_limit_) {
    if (field->is_extension()) {
      // Conflicts with the field that already exists in the sequential range.
      return false;
    }
    // Only return true if the field at that index matches. Otherwise it
    // conflicts with the existing field in the sequential range.
    return field->containing_type()->field(field->number() - 1) == field;
  }

  return fields_by_number_.insert(field).second;
}